

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh2_client.cc
# Opt level: O0

int __thiscall common::SSH2Client::RawMode(SSH2Client *this)

{
  int iVar1;
  undefined1 local_50 [8];
  termios tio;
  int rc;
  SSH2Client *this_local;
  
  unique0x1000008a = this;
  iVar1 = fileno(_stdin);
  tio.c_ispeed = tcgetattr(iVar1,(termios *)local_50);
  if (tio.c_ispeed != 0xffffffff) {
    memcpy(&this->saved_tio,local_50,0x3c);
    local_50._0_4_ = local_50._0_4_ & 0xfffffa14;
    local_50._4_4_ = local_50._4_4_ & 0xfffffffe;
    tio.c_oflag = tio.c_oflag & 0xffff7fb4;
    tio.c_iflag = tio.c_iflag & 0xfffffecf | 0x30;
    iVar1 = fileno(_stdin);
    tio.c_ispeed = tcsetattr(iVar1,1,(termios *)local_50);
  }
  return tio.c_ispeed;
}

Assistant:

int SSH2Client::RawMode() {
    int rc;
    struct termios tio;

    rc = tcgetattr(fileno(stdin), &tio);
    if (rc != -1) {
        saved_tio = tio;
        /* do the equivalent of cfmakeraw() manually, to build on Solaris */
        tio.c_iflag &= ~(IGNBRK|BRKINT|PARMRK|ISTRIP|INLCR|IGNCR|ICRNL|IXON);
        tio.c_oflag &= ~OPOST;
        tio.c_lflag &= ~(ECHO|ECHONL|ICANON|ISIG|IEXTEN);
        tio.c_cflag &= ~(CSIZE|PARENB);
        tio.c_cflag |= CS8;
        rc = tcsetattr(fileno(stdin), TCSADRAIN, &tio);
    }
    return rc;
}